

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmTable.c
# Opt level: O0

void Nm_ManProfile(Nm_Man_t *p)

{
  int local_20;
  uint local_1c;
  int e;
  int Counter;
  Nm_Entry_t *pEntry;
  Nm_Man_t *p_local;
  
  printf("I2N table: ");
  for (local_20 = 0; local_20 < p->nBins; local_20 = local_20 + 1) {
    local_1c = 0;
    for (_e = p->pBinsI2N[local_20]; _e != (Nm_Entry_t *)0x0; _e = _e->pNextI2N) {
      local_1c = local_1c + 1;
    }
    printf("%d ",(ulong)local_1c);
  }
  printf("\n");
  printf("N2I table: ");
  for (local_20 = 0; local_20 < p->nBins; local_20 = local_20 + 1) {
    local_1c = 0;
    for (_e = p->pBinsN2I[local_20]; _e != (Nm_Entry_t *)0x0; _e = _e->pNextN2I) {
      local_1c = local_1c + 1;
    }
    printf("%d ",(ulong)local_1c);
  }
  printf("\n");
  return;
}

Assistant:

void Nm_ManProfile( Nm_Man_t * p )
{
    Nm_Entry_t * pEntry;
    int Counter, e;
    printf( "I2N table: " );
    for ( e = 0; e < p->nBins; e++ )
    {
        Counter = 0;
        for ( pEntry = p->pBinsI2N[e]; pEntry; pEntry = pEntry->pNextI2N )
            Counter++;
        printf( "%d ", Counter );
    }
    printf( "\n" );
    printf( "N2I table: " );
    for ( e = 0; e < p->nBins; e++ )
    {
        Counter = 0;
        for ( pEntry = p->pBinsN2I[e]; pEntry; pEntry = pEntry->pNextN2I )
            Counter++;
        printf( "%d ", Counter );
    }
    printf( "\n" );
}